

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O3

Real __thiscall amrex::MLCellLinOp::AnyNormInfMask(MLCellLinOp *this,int amrlev,Any *a,bool local)

{
  bool bVar1;
  uint uVar2;
  FabArray<amrex::FArrayBox> *this_00;
  long lVar3;
  FabArray<amrex::FArrayBox> *this_01;
  long lVar4;
  _Head_base<0UL,_amrex::iMultiFab_*,_false> fine_mask;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  Real RVar20;
  double dVar21;
  MFIter mfi;
  double local_218;
  Array4<const_double> local_170;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  this_00 = &Any::get<amrex::MultiFab>(a)->super_FabArray<amrex::FArrayBox>;
  iVar7 = (this->super_MLLinOp).m_num_amr_levels + -1;
  uVar2 = (*(this->super_MLLinOp)._vptr_MLLinOp[5])(this);
  bVar1 = FabArray<amrex::FArrayBox>::isAllRegular(this_00);
  if (!bVar1) {
    lVar3 = __dynamic_cast(**(undefined8 **)
                             &(this->super_MLLinOp).m_factory.
                              super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[amrlev].
                              super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                              .
                              super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                           ,&FabFactory<amrex::FArrayBox>::typeinfo,&EBFArrayBoxFactory::typeinfo,0)
    ;
    this_01 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar3 + 0xd8))->
               super_FabArray<amrex::FArrayBox>;
    if (iVar7 == amrlev) {
      MFIter::MFIter(&local_90,&this_00->super_FabArrayBase,true);
      local_218 = 0.0;
      if (local_90.currentIndex < local_90.endIndex) {
        local_218 = 0.0;
        do {
          MFIter::tilebox((Box *)&local_110,&local_90);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_170,this_00,&local_90)
          ;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_d0,this_01,&local_90);
          if (0 < (int)uVar2) {
            lVar17 = (long)(int)local_110.jstride;
            lVar14 = (long)local_110.p._4_4_;
            lVar3 = (lVar14 - local_170.begin.y) * local_170.jstride * 8 +
                    (lVar17 - local_170.begin.z) * local_170.kstride * 8 +
                    (long)(int)local_110.p * 8 + (long)local_170.begin.x * -8 + (long)local_170.p;
            uVar11 = 0;
            do {
              lVar5 = lVar3;
              lVar10 = lVar17;
              lVar15 = (lVar14 - local_d0.begin.y) * local_d0.jstride * 8 +
                       (lVar17 - local_d0.begin.z) * local_d0.kstride * 8 +
                       (long)(int)local_110.p * 8 + (long)local_d0.begin.x * -8 + (long)local_d0.p;
              if ((int)local_110.jstride <= local_110.kstride._4_4_) {
                do {
                  lVar12 = lVar14;
                  lVar18 = lVar15;
                  lVar19 = lVar5;
                  if (local_110.p._4_4_ <= (int)local_110.kstride) {
                    do {
                      if ((int)local_110.p <= local_110.jstride._4_4_) {
                        lVar9 = 0;
                        dVar21 = local_218;
                        do {
                          local_218 = ABS(*(double *)(lVar19 + lVar9 * 8) *
                                          *(double *)(lVar18 + lVar9 * 8));
                          if (local_218 <= dVar21) {
                            local_218 = dVar21;
                          }
                          lVar9 = lVar9 + 1;
                          dVar21 = local_218;
                        } while ((local_110.jstride._4_4_ - (int)local_110.p) + 1 != (int)lVar9);
                      }
                      lVar12 = lVar12 + 1;
                      lVar19 = lVar19 + local_170.jstride * 8;
                      lVar18 = lVar18 + local_d0.jstride * 8;
                    } while ((int)local_110.kstride + 1 != (int)lVar12);
                  }
                  lVar10 = lVar10 + 1;
                  lVar5 = lVar5 + local_170.kstride * 8;
                  lVar15 = lVar15 + local_d0.kstride * 8;
                } while (local_110.kstride._4_4_ + 1 != (int)lVar10);
              }
              uVar11 = uVar11 + 1;
              lVar3 = lVar3 + local_170.nstride * 8;
            } while (uVar11 != uVar2);
          }
          MFIter::operator++(&local_90);
        } while (local_90.currentIndex < local_90.endIndex);
      }
    }
    else {
      MFIter::MFIter(&local_90,&this_00->super_FabArrayBase,true);
      local_218 = 0.0;
      if (local_90.currentIndex < local_90.endIndex) {
        local_218 = 0.0;
        do {
          MFIter::tilebox(&local_12c,&local_90);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_170,this_00,&local_90)
          ;
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)&local_d0,
                     (FabArray<amrex::IArrayBox> *)
                     (this->m_norm_fine_mask).
                     super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
                     super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                     ,&local_90);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_110,this_01,&local_90)
          ;
          if (0 < (int)uVar2) {
            lVar15 = (long)local_12c.smallend.vect[2];
            lVar17 = (long)local_12c.smallend.vect[1];
            lVar5 = (long)local_12c.smallend.vect[0];
            lVar14 = CONCAT44(local_110.kstride._4_4_,(int)local_110.kstride) * 8;
            lVar10 = CONCAT44(local_110.jstride._4_4_,(int)local_110.jstride) * 8;
            lVar3 = (lVar17 - local_170.begin.y) * local_170.jstride * 8 +
                    (lVar15 - local_170.begin.z) * local_170.kstride * 8 + lVar5 * 8 +
                    (long)local_170.begin.x * -8 + (long)local_170.p;
            uVar11 = 0;
            do {
              lVar12 = (lVar17 - local_d0.begin.y) * local_d0.jstride * 4 +
                       (lVar15 - local_d0.begin.z) * local_d0.kstride * 4 + lVar5 * 4 +
                       (long)local_d0.begin.x * -4 + (long)local_d0.p;
              lVar18 = lVar3;
              lVar19 = lVar15;
              lVar9 = (lVar17 - local_110.begin.y) * lVar10 + (lVar15 - local_110.begin.z) * lVar14
                      + lVar5 * 8 + (long)local_110.begin.x * -8 +
                      CONCAT44(local_110.p._4_4_,(int)local_110.p);
              if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
                do {
                  lVar4 = lVar9;
                  lVar6 = lVar17;
                  lVar13 = lVar18;
                  lVar16 = lVar12;
                  if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
                    do {
                      if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                        lVar8 = 0;
                        dVar21 = local_218;
                        do {
                          local_218 = dVar21;
                          if ((*(int *)(lVar16 + lVar8 * 4) != 0) &&
                             (local_218 = ABS(*(double *)(lVar13 + lVar8 * 8) *
                                              *(double *)(lVar4 + lVar8 * 8)), local_218 <= dVar21))
                          {
                            local_218 = dVar21;
                          }
                          lVar8 = lVar8 + 1;
                          dVar21 = local_218;
                        } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 !=
                                 (int)lVar8);
                      }
                      lVar6 = lVar6 + 1;
                      lVar13 = lVar13 + local_170.jstride * 8;
                      lVar4 = lVar4 + lVar10;
                      lVar16 = lVar16 + local_d0.jstride * 4;
                    } while (local_12c.bigend.vect[1] + 1 != (int)lVar6);
                  }
                  lVar19 = lVar19 + 1;
                  lVar18 = lVar18 + local_170.kstride * 8;
                  lVar9 = lVar9 + lVar14;
                  lVar12 = lVar12 + local_d0.kstride * 4;
                } while (local_12c.bigend.vect[2] + 1 != (int)lVar19);
              }
              uVar11 = uVar11 + 1;
              lVar3 = lVar3 + local_170.nstride * 8;
            } while (uVar11 != uVar2);
          }
          MFIter::operator++(&local_90);
        } while (local_90.currentIndex < local_90.endIndex);
      }
    }
    MFIter::~MFIter(&local_90);
    return local_218;
  }
  if (iVar7 == amrlev) {
    fine_mask._M_head_impl = (iMultiFab *)0x0;
  }
  else {
    fine_mask._M_head_impl =
         *(iMultiFab **)
          &(this->m_norm_fine_mask).
           super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
           super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
  }
  RVar20 = MLLinOp::MFNormInf(&this->super_MLLinOp,(MultiFab *)this_00,fine_mask._M_head_impl,true);
  return RVar20;
}

Assistant:

Real
MLCellLinOp::AnyNormInfMask (int amrlev, Any const& a, bool local) const
{
    AMREX_ASSERT(a.is<MultiFab>());
    auto& mf = a.get<MultiFab>();

    const int finest_level = NAMRLevels() - 1;
    Real norm = 0._rt;
#ifdef AMREX_USE_EB
    const int ncomp = getNComp();
    if (! mf.isAllRegular()) {
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(Factory(amrlev));
        const MultiFab& vfrac = factory->getVolFrac();
        if (amrlev == finest_level) {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion()) {
                auto const& ma = mf.const_arrays();
                auto const& vfrac_ma = vfrac.const_arrays();
                norm = ParReduce(TypeList<ReduceOpMax>{}, TypeList<Real>{},
                                 mf, IntVect(0), ncomp,
                                 [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n)
                                     -> GpuTuple<Real>
                                 {
                                     return amrex::Math::abs(ma[box_no](i,j,k,n)
                                                             *vfrac_ma[box_no](i,j,k));
                                 });
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:norm)
#endif
                for (MFIter mfi(mf,true); mfi.isValid(); ++mfi) {
                    Box const& bx = mfi.tilebox();
                    auto const& fab = mf.const_array(mfi);
                    auto const& v = vfrac.const_array(mfi);
                    AMREX_LOOP_4D(bx, ncomp, i, j, k, n,
                    {
                        norm = std::max(norm, amrex::Math::abs(fab(i,j,k,n)*v(i,j,k)));
                    });
                }
            }
        } else {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion()) {
                auto const& ma = mf.const_arrays();
                auto const& mask_ma = m_norm_fine_mask[amrlev]->const_arrays();
                auto const& vfrac_ma = vfrac.const_arrays();
                norm = ParReduce(TypeList<ReduceOpMax>{}, TypeList<Real>{},
                                 mf, IntVect(0), ncomp,
                                 [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n)
                                     -> GpuTuple<Real>
                                 {
                                     if (mask_ma[box_no](i,j,k)) {
                                         return amrex::Math::abs(ma[box_no](i,j,k,n)
                                                                 *vfrac_ma[box_no](i,j,k));
                                     } else {
                                         return Real(0.0);
                                     }
                                 });
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:norm)
#endif
                for (MFIter mfi(mf,true); mfi.isValid(); ++mfi) {
                    Box const& bx = mfi.tilebox();
                    auto const& fab = mf.const_array(mfi);
                    auto const& mask = m_norm_fine_mask[amrlev]->const_array(mfi);
                    auto const& v = vfrac.const_array(mfi);
                    AMREX_LOOP_4D(bx, ncomp, i, j, k, n,
                    {
                        if (mask(i,j,k)) {
                            norm = std::max(norm, amrex::Math::abs(fab(i,j,k,n)*v(i,j,k)));
                        }
                    });
                }
            }
        }
    } else
#endif
    {
        iMultiFab const* fine_mask = (amrlev == finest_level)
            ? nullptr : m_norm_fine_mask[amrlev].get();
        norm = MFNormInf(mf, fine_mask, true);
    }

    if (!local) ParallelAllReduce::Max(norm, ParallelContext::CommunicatorSub());
    return norm;
}